

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int wait_ms(int timeout_ms)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  __suseconds_t _Var3;
  int iVar4;
  uint *puVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  timeval now;
  timeval local_40;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    iVar8 = -1;
  }
  else {
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    _Var3 = local_40.tv_usec;
    _Var2 = local_40.tv_sec;
    iVar8 = timeout_ms;
    do {
      iVar4 = poll((pollfd *)0x0,0,iVar8);
      if (iVar4 != -1) break;
      puVar5 = (uint *)__errno_location();
      if ((*puVar5 & 0xfffffffb) != 0) break;
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      lVar7 = local_40.tv_sec - _Var2;
      iVar8 = 1;
      if ((lVar7 < 0x20c49ba5e353f7) && (iVar8 = 0, -0x20c49ba5e353f7 < lVar7)) {
        auVar1 = SEXT816(local_40.tv_usec - _Var3) * SEXT816(-0x20c49ba5e353f7cf);
        iVar8 = ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + (int)lVar7 * -1000;
      }
      iVar8 = iVar8 + timeout_ms;
    } while (0 < iVar8);
    iVar8 = -(uint)(iVar4 != 0);
  }
  return iVar8;
}

Assistant:

int wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
  int error;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    errno = EINVAL;
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = tvnow();
  do {
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = errno;
    if(error && (error != EINTR))
      break;
    pending_ms = timeout_ms - (int)timediff(tvnow(), initial_tv);
    if(pending_ms <= 0)
      break;
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}